

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

Type * __thiscall
SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
          (SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *pSVar4;
  
  pSVar4 = (SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (pSVar4 == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x137,"(!Empty())","!Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pSVar4 = (SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)
             (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  }
  return (Type *)&pSVar4->super_RealCount;
}

Assistant:

bool Prepend(TAllocator * allocator, TData const& data)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, data);
        if (newNode)
        {
            newNode->Next() = this->Next();
            this->Next() = newNode;
            this->IncrementCount();
            return true;
        }
        return false;
    }